

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_impl.h
# Opt level: O0

void test_keypair(void)

{
  int iVar1;
  int ecount;
  int pk_parity_tmp;
  int pk_parity;
  secp256k1_xonly_pubkey xonly_pk_tmp;
  secp256k1_xonly_pubkey xonly_pk;
  secp256k1_pubkey pk_tmp;
  secp256k1_pubkey pk;
  secp256k1_keypair keypair;
  uchar overflows [32];
  uchar zeros96 [96];
  uchar sk_tmp [32];
  uchar sk [32];
  undefined4 in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdcc;
  int iVar2;
  int in_stack_fffffffffffffdd0;
  int in_stack_fffffffffffffdd4;
  secp256k1_context *in_stack_fffffffffffffdd8;
  undefined1 local_1e8 [8];
  secp256k1_keypair *in_stack_fffffffffffffe20;
  int *in_stack_fffffffffffffe28;
  secp256k1_xonly_pubkey *in_stack_fffffffffffffe30;
  secp256k1_context *in_stack_fffffffffffffe38;
  uchar *in_stack_fffffffffffffe48;
  secp256k1_keypair *in_stack_fffffffffffffe50;
  secp256k1_context *in_stack_fffffffffffffe58;
  undefined1 local_168 [64];
  undefined1 local_128 [96];
  undefined1 local_c8 [32];
  undefined1 local_a8 [96];
  undefined1 local_48 [32];
  undefined1 local_28 [40];
  
  memset(local_a8,0,0x60);
  set_counting_callbacks
            ((secp256k1_context *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
             (int *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
  set_counting_callbacks
            ((secp256k1_context *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
             (int *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
  memset(local_c8,0xff,0x20);
  iVar2 = 0;
  secp256k1_testrand256((uchar *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
  iVar1 = secp256k1_keypair_create
                    (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x15d,"test condition failed: secp256k1_keypair_create(CTX, &keypair, sk) == 1");
    abort();
  }
  iVar1 = secp256k1_memcmp_var(local_a8,local_128,0x60);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x15e,
            "test condition failed: secp256k1_memcmp_var(zeros96, &keypair, sizeof(keypair)) != 0");
    abort();
  }
  if (iVar2 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x15f,"test condition failed: ecount == 0");
    abort();
  }
  iVar1 = secp256k1_keypair_create
                    (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x160,"test condition failed: secp256k1_keypair_create(CTX, &keypair, sk) == 1");
    abort();
  }
  iVar1 = secp256k1_memcmp_var(local_a8,local_128,0x60);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x161,
            "test condition failed: secp256k1_memcmp_var(zeros96, &keypair, sizeof(keypair)) != 0");
    abort();
  }
  if (iVar2 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x162,"test condition failed: ecount == 0");
    abort();
  }
  iVar1 = secp256k1_keypair_create
                    (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x163,"test condition failed: secp256k1_keypair_create(CTX, NULL, sk) == 0");
    abort();
  }
  if (iVar2 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x164,"test condition failed: ecount == 1");
    abort();
  }
  iVar1 = secp256k1_keypair_create
                    (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x165,"test condition failed: secp256k1_keypair_create(CTX, &keypair, NULL) == 0");
    abort();
  }
  iVar1 = secp256k1_memcmp_var(local_a8,local_128,0x60);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x166,
            "test condition failed: secp256k1_memcmp_var(zeros96, &keypair, sizeof(keypair)) == 0");
    abort();
  }
  if (iVar2 != 2) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x167,"test condition failed: ecount == 2");
    abort();
  }
  iVar1 = secp256k1_keypair_create
                    (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x168,"test condition failed: secp256k1_keypair_create(CTX, &keypair, sk) == 1");
    abort();
  }
  if (iVar2 != 2) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x169,"test condition failed: ecount == 2");
    abort();
  }
  iVar1 = secp256k1_keypair_create
                    (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x16a,"test condition failed: secp256k1_keypair_create(STATIC_CTX, &keypair, sk) == 0")
    ;
    abort();
  }
  iVar1 = secp256k1_memcmp_var(local_a8,local_128,0x60);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x16b,
            "test condition failed: secp256k1_memcmp_var(zeros96, &keypair, sizeof(keypair)) == 0");
    abort();
  }
  if (iVar2 != 3) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x16c,"test condition failed: ecount == 3");
    abort();
  }
  iVar1 = secp256k1_keypair_create
                    (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x16f,"test condition failed: secp256k1_keypair_create(CTX, &keypair, zeros96) == 0");
    abort();
  }
  iVar1 = secp256k1_memcmp_var(local_a8,local_128,0x60);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x170,
            "test condition failed: secp256k1_memcmp_var(zeros96, &keypair, sizeof(keypair)) == 0");
    abort();
  }
  iVar1 = secp256k1_keypair_create
                    (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x171,"test condition failed: secp256k1_keypair_create(CTX, &keypair, overflows) == 0")
    ;
    abort();
  }
  iVar1 = secp256k1_memcmp_var(local_a8,local_128,0x60);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x172,
            "test condition failed: secp256k1_memcmp_var(zeros96, &keypair, sizeof(keypair)) == 0");
    abort();
  }
  iVar2 = 0;
  secp256k1_testrand256((uchar *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
  iVar1 = secp256k1_keypair_create
                    (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x177,"test condition failed: secp256k1_keypair_create(CTX, &keypair, sk) == 1");
    abort();
  }
  iVar1 = secp256k1_keypair_pub
                    (in_stack_fffffffffffffdd8,
                     (secp256k1_pubkey *)
                     CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                     (secp256k1_keypair *)CONCAT44(iVar2,in_stack_fffffffffffffdc8));
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x178,"test condition failed: secp256k1_keypair_pub(CTX, &pk, &keypair) == 1");
    abort();
  }
  iVar1 = secp256k1_keypair_pub
                    (in_stack_fffffffffffffdd8,
                     (secp256k1_pubkey *)
                     CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                     (secp256k1_keypair *)CONCAT44(iVar2,in_stack_fffffffffffffdc8));
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x179,"test condition failed: secp256k1_keypair_pub(CTX, NULL, &keypair) == 0");
    abort();
  }
  if (iVar2 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x17a,"test condition failed: ecount == 1");
    abort();
  }
  iVar1 = secp256k1_keypair_pub
                    (in_stack_fffffffffffffdd8,
                     (secp256k1_pubkey *)
                     CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                     (secp256k1_keypair *)CONCAT44(1,in_stack_fffffffffffffdc8));
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x17b,"test condition failed: secp256k1_keypair_pub(CTX, &pk, NULL) == 0");
    abort();
  }
  if (iVar2 != 2) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x17c,"test condition failed: ecount == 2");
    abort();
  }
  iVar1 = secp256k1_memcmp_var(local_a8,local_168,0x40);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x17d,"test condition failed: secp256k1_memcmp_var(zeros96, &pk, sizeof(pk)) == 0");
    abort();
  }
  memset(local_128,0,0x60);
  iVar1 = secp256k1_keypair_pub
                    (in_stack_fffffffffffffdd8,
                     (secp256k1_pubkey *)
                     CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                     (secp256k1_keypair *)CONCAT44(iVar2,in_stack_fffffffffffffdc8));
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x181,"test condition failed: secp256k1_keypair_pub(CTX, &pk, &keypair) == 1");
    abort();
  }
  iVar1 = secp256k1_memcmp_var(local_a8,local_168,0x40);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x182,"test condition failed: secp256k1_memcmp_var(zeros96, &pk, sizeof(pk)) == 0");
    abort();
  }
  iVar1 = secp256k1_ec_pubkey_create
                    (in_stack_fffffffffffffe58,(secp256k1_pubkey *)in_stack_fffffffffffffe50,
                     in_stack_fffffffffffffe48);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x185,"test condition failed: secp256k1_ec_pubkey_create(CTX, &pk, sk) == 1");
    abort();
  }
  iVar1 = secp256k1_keypair_create
                    (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x186,"test condition failed: secp256k1_keypair_create(CTX, &keypair, sk) == 1");
    abort();
  }
  iVar1 = secp256k1_keypair_pub
                    (in_stack_fffffffffffffdd8,
                     (secp256k1_pubkey *)
                     CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                     (secp256k1_keypair *)CONCAT44(iVar2,in_stack_fffffffffffffdc8));
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x187,"test condition failed: secp256k1_keypair_pub(CTX, &pk_tmp, &keypair) == 1");
    abort();
  }
  iVar1 = secp256k1_memcmp_var(local_168,&stack0xfffffffffffffe58,0x40);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x188,"test condition failed: secp256k1_memcmp_var(&pk, &pk_tmp, sizeof(pk)) == 0");
    abort();
  }
  iVar2 = 0;
  secp256k1_testrand256((uchar *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
  iVar1 = secp256k1_keypair_create
                    (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x18d,"test condition failed: secp256k1_keypair_create(CTX, &keypair, sk) == 1");
    abort();
  }
  iVar1 = secp256k1_keypair_xonly_pub
                    (in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
                     in_stack_fffffffffffffe20);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x18e,
            "test condition failed: secp256k1_keypair_xonly_pub(CTX, &xonly_pk, &pk_parity, &keypair) == 1"
           );
    abort();
  }
  iVar1 = secp256k1_keypair_xonly_pub
                    (in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
                     in_stack_fffffffffffffe20);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,399,
            "test condition failed: secp256k1_keypair_xonly_pub(CTX, NULL, &pk_parity, &keypair) == 0"
           );
    abort();
  }
  if (iVar2 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,400,"test condition failed: ecount == 1");
    abort();
  }
  iVar1 = secp256k1_keypair_xonly_pub
                    (in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
                     in_stack_fffffffffffffe20);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x191,
            "test condition failed: secp256k1_keypair_xonly_pub(CTX, &xonly_pk, NULL, &keypair) == 1"
           );
    abort();
  }
  iVar1 = secp256k1_keypair_xonly_pub
                    (in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
                     in_stack_fffffffffffffe20);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x192,
            "test condition failed: secp256k1_keypair_xonly_pub(CTX, &xonly_pk, &pk_parity, NULL) == 0"
           );
    abort();
  }
  if (iVar2 != 2) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x193,"test condition failed: ecount == 2");
    abort();
  }
  iVar1 = secp256k1_memcmp_var(local_a8,local_1e8,0x40);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x194,
            "test condition failed: secp256k1_memcmp_var(zeros96, &xonly_pk, sizeof(xonly_pk)) == 0"
           );
    abort();
  }
  iVar1 = secp256k1_keypair_xonly_pub
                    (in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
                     in_stack_fffffffffffffe20);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x197,
            "test condition failed: secp256k1_keypair_xonly_pub(CTX, &xonly_pk, &pk_parity, &keypair) == 1"
           );
    abort();
  }
  memset(local_128,0,0x60);
  iVar1 = secp256k1_keypair_xonly_pub
                    (in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
                     in_stack_fffffffffffffe20);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x199,
            "test condition failed: secp256k1_keypair_xonly_pub(CTX, &xonly_pk, &pk_parity, &keypair) == 0"
           );
    abort();
  }
  iVar1 = secp256k1_memcmp_var(local_a8,local_1e8,0x40);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x19a,
            "test condition failed: secp256k1_memcmp_var(zeros96, &xonly_pk, sizeof(xonly_pk)) == 0"
           );
    abort();
  }
  if (iVar2 != 3) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x19b,"test condition failed: ecount == 3");
    abort();
  }
  iVar1 = secp256k1_ec_pubkey_create
                    (in_stack_fffffffffffffe58,(secp256k1_pubkey *)in_stack_fffffffffffffe50,
                     in_stack_fffffffffffffe48);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x19e,"test condition failed: secp256k1_ec_pubkey_create(CTX, &pk, sk) == 1");
    abort();
  }
  iVar1 = secp256k1_xonly_pubkey_from_pubkey
                    (in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
                     (secp256k1_pubkey *)in_stack_fffffffffffffe20);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x19f,
            "test condition failed: secp256k1_xonly_pubkey_from_pubkey(CTX, &xonly_pk, &pk_parity, &pk) == 1"
           );
    abort();
  }
  iVar1 = secp256k1_keypair_create
                    (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x1a0,"test condition failed: secp256k1_keypair_create(CTX, &keypair, sk) == 1");
    abort();
  }
  iVar1 = secp256k1_keypair_xonly_pub
                    (in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
                     in_stack_fffffffffffffe20);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x1a1,
            "test condition failed: secp256k1_keypair_xonly_pub(CTX, &xonly_pk_tmp, &pk_parity_tmp, &keypair) == 1"
           );
    abort();
  }
  iVar1 = secp256k1_memcmp_var(local_1e8,&stack0xfffffffffffffdd8,0x40);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x1a2,
            "test condition failed: secp256k1_memcmp_var(&xonly_pk, &xonly_pk_tmp, sizeof(pk)) == 0"
           );
    abort();
  }
  if (in_stack_fffffffffffffdd4 != in_stack_fffffffffffffdd0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x1a3,"test condition failed: pk_parity == pk_parity_tmp");
    abort();
  }
  iVar2 = 0;
  secp256k1_testrand256((uchar *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
  iVar1 = secp256k1_keypair_create
                    (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x1a8,"test condition failed: secp256k1_keypair_create(CTX, &keypair, sk) == 1");
    abort();
  }
  iVar1 = secp256k1_keypair_sec
                    (in_stack_fffffffffffffdd8,
                     (uchar *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                     (secp256k1_keypair *)CONCAT44(iVar2,in_stack_fffffffffffffdc8));
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x1a9,"test condition failed: secp256k1_keypair_sec(CTX, sk_tmp, &keypair) == 1");
    abort();
  }
  iVar1 = secp256k1_keypair_sec
                    (in_stack_fffffffffffffdd8,
                     (uchar *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                     (secp256k1_keypair *)CONCAT44(iVar2,in_stack_fffffffffffffdc8));
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x1aa,"test condition failed: secp256k1_keypair_sec(CTX, NULL, &keypair) == 0");
    abort();
  }
  if (iVar2 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x1ab,"test condition failed: ecount == 1");
    abort();
  }
  iVar1 = secp256k1_keypair_sec
                    (in_stack_fffffffffffffdd8,
                     (uchar *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                     (secp256k1_keypair *)CONCAT44(1,in_stack_fffffffffffffdc8));
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x1ac,"test condition failed: secp256k1_keypair_sec(CTX, sk_tmp, NULL) == 0");
    abort();
  }
  if (iVar2 != 2) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x1ad,"test condition failed: ecount == 2");
    abort();
  }
  iVar1 = secp256k1_memcmp_var(local_a8,local_48,0x20);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x1ae,
            "test condition failed: secp256k1_memcmp_var(zeros96, sk_tmp, sizeof(sk_tmp)) == 0");
    abort();
  }
  iVar1 = secp256k1_keypair_create
                    (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x1b1,"test condition failed: secp256k1_keypair_create(CTX, &keypair, sk) == 1");
    abort();
  }
  iVar1 = secp256k1_keypair_sec
                    (in_stack_fffffffffffffdd8,
                     (uchar *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                     (secp256k1_keypair *)CONCAT44(iVar2,in_stack_fffffffffffffdc8));
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x1b2,"test condition failed: secp256k1_keypair_sec(CTX, sk_tmp, &keypair) == 1");
    abort();
  }
  iVar1 = secp256k1_memcmp_var(local_28,local_48,0x20);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x1b3,"test condition failed: secp256k1_memcmp_var(sk, sk_tmp, sizeof(sk_tmp)) == 0");
    abort();
  }
  memset(local_128,0,0x60);
  iVar1 = secp256k1_keypair_sec
                    (in_stack_fffffffffffffdd8,
                     (uchar *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                     (secp256k1_keypair *)CONCAT44(iVar2,in_stack_fffffffffffffdc8));
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x1b8,"test condition failed: secp256k1_keypair_sec(CTX, sk_tmp, &keypair) == 1");
    abort();
  }
  iVar1 = secp256k1_memcmp_var(local_a8,local_48,0x20);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x1b9,
            "test condition failed: secp256k1_memcmp_var(zeros96, sk_tmp, sizeof(sk_tmp)) == 0");
    abort();
  }
  secp256k1_context_set_error_callback
            ((secp256k1_context *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
             (_func_void_char_ptr_void_ptr *)CONCAT44(iVar2,in_stack_fffffffffffffdc8),
             (void *)0x14e5e3);
  secp256k1_context_set_illegal_callback
            ((secp256k1_context *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
             (_func_void_char_ptr_void_ptr *)CONCAT44(iVar2,in_stack_fffffffffffffdc8),
             (void *)0x14e5f6);
  return;
}

Assistant:

static void test_keypair(void) {
    unsigned char sk[32];
    unsigned char sk_tmp[32];
    unsigned char zeros96[96] = { 0 };
    unsigned char overflows[32];
    secp256k1_keypair keypair;
    secp256k1_pubkey pk, pk_tmp;
    secp256k1_xonly_pubkey xonly_pk, xonly_pk_tmp;
    int pk_parity, pk_parity_tmp;
    int ecount;

    set_counting_callbacks(CTX, &ecount);
    set_counting_callbacks(STATIC_CTX, &ecount);

    CHECK(sizeof(zeros96) == sizeof(keypair));
    memset(overflows, 0xFF, sizeof(overflows));

    /* Test keypair_create */
    ecount = 0;
    secp256k1_testrand256(sk);
    CHECK(secp256k1_keypair_create(CTX, &keypair, sk) == 1);
    CHECK(secp256k1_memcmp_var(zeros96, &keypair, sizeof(keypair)) != 0);
    CHECK(ecount == 0);
    CHECK(secp256k1_keypair_create(CTX, &keypair, sk) == 1);
    CHECK(secp256k1_memcmp_var(zeros96, &keypair, sizeof(keypair)) != 0);
    CHECK(ecount == 0);
    CHECK(secp256k1_keypair_create(CTX, NULL, sk) == 0);
    CHECK(ecount == 1);
    CHECK(secp256k1_keypair_create(CTX, &keypair, NULL) == 0);
    CHECK(secp256k1_memcmp_var(zeros96, &keypair, sizeof(keypair)) == 0);
    CHECK(ecount == 2);
    CHECK(secp256k1_keypair_create(CTX, &keypair, sk) == 1);
    CHECK(ecount == 2);
    CHECK(secp256k1_keypair_create(STATIC_CTX, &keypair, sk) == 0);
    CHECK(secp256k1_memcmp_var(zeros96, &keypair, sizeof(keypair)) == 0);
    CHECK(ecount == 3);

    /* Invalid secret key */
    CHECK(secp256k1_keypair_create(CTX, &keypair, zeros96) == 0);
    CHECK(secp256k1_memcmp_var(zeros96, &keypair, sizeof(keypair)) == 0);
    CHECK(secp256k1_keypair_create(CTX, &keypair, overflows) == 0);
    CHECK(secp256k1_memcmp_var(zeros96, &keypair, sizeof(keypair)) == 0);

    /* Test keypair_pub */
    ecount = 0;
    secp256k1_testrand256(sk);
    CHECK(secp256k1_keypair_create(CTX, &keypair, sk) == 1);
    CHECK(secp256k1_keypair_pub(CTX, &pk, &keypair) == 1);
    CHECK(secp256k1_keypair_pub(CTX, NULL, &keypair) == 0);
    CHECK(ecount == 1);
    CHECK(secp256k1_keypair_pub(CTX, &pk, NULL) == 0);
    CHECK(ecount == 2);
    CHECK(secp256k1_memcmp_var(zeros96, &pk, sizeof(pk)) == 0);

    /* Using an invalid keypair is fine for keypair_pub */
    memset(&keypair, 0, sizeof(keypair));
    CHECK(secp256k1_keypair_pub(CTX, &pk, &keypair) == 1);
    CHECK(secp256k1_memcmp_var(zeros96, &pk, sizeof(pk)) == 0);

    /* keypair holds the same pubkey as pubkey_create */
    CHECK(secp256k1_ec_pubkey_create(CTX, &pk, sk) == 1);
    CHECK(secp256k1_keypair_create(CTX, &keypair, sk) == 1);
    CHECK(secp256k1_keypair_pub(CTX, &pk_tmp, &keypair) == 1);
    CHECK(secp256k1_memcmp_var(&pk, &pk_tmp, sizeof(pk)) == 0);

    /** Test keypair_xonly_pub **/
    ecount = 0;
    secp256k1_testrand256(sk);
    CHECK(secp256k1_keypair_create(CTX, &keypair, sk) == 1);
    CHECK(secp256k1_keypair_xonly_pub(CTX, &xonly_pk, &pk_parity, &keypair) == 1);
    CHECK(secp256k1_keypair_xonly_pub(CTX, NULL, &pk_parity, &keypair) == 0);
    CHECK(ecount == 1);
    CHECK(secp256k1_keypair_xonly_pub(CTX, &xonly_pk, NULL, &keypair) == 1);
    CHECK(secp256k1_keypair_xonly_pub(CTX, &xonly_pk, &pk_parity, NULL) == 0);
    CHECK(ecount == 2);
    CHECK(secp256k1_memcmp_var(zeros96, &xonly_pk, sizeof(xonly_pk)) == 0);
    /* Using an invalid keypair will set the xonly_pk to 0 (first reset
     * xonly_pk). */
    CHECK(secp256k1_keypair_xonly_pub(CTX, &xonly_pk, &pk_parity, &keypair) == 1);
    memset(&keypair, 0, sizeof(keypair));
    CHECK(secp256k1_keypair_xonly_pub(CTX, &xonly_pk, &pk_parity, &keypair) == 0);
    CHECK(secp256k1_memcmp_var(zeros96, &xonly_pk, sizeof(xonly_pk)) == 0);
    CHECK(ecount == 3);

    /** keypair holds the same xonly pubkey as pubkey_create **/
    CHECK(secp256k1_ec_pubkey_create(CTX, &pk, sk) == 1);
    CHECK(secp256k1_xonly_pubkey_from_pubkey(CTX, &xonly_pk, &pk_parity, &pk) == 1);
    CHECK(secp256k1_keypair_create(CTX, &keypair, sk) == 1);
    CHECK(secp256k1_keypair_xonly_pub(CTX, &xonly_pk_tmp, &pk_parity_tmp, &keypair) == 1);
    CHECK(secp256k1_memcmp_var(&xonly_pk, &xonly_pk_tmp, sizeof(pk)) == 0);
    CHECK(pk_parity == pk_parity_tmp);

    /* Test keypair_seckey */
    ecount = 0;
    secp256k1_testrand256(sk);
    CHECK(secp256k1_keypair_create(CTX, &keypair, sk) == 1);
    CHECK(secp256k1_keypair_sec(CTX, sk_tmp, &keypair) == 1);
    CHECK(secp256k1_keypair_sec(CTX, NULL, &keypair) == 0);
    CHECK(ecount == 1);
    CHECK(secp256k1_keypair_sec(CTX, sk_tmp, NULL) == 0);
    CHECK(ecount == 2);
    CHECK(secp256k1_memcmp_var(zeros96, sk_tmp, sizeof(sk_tmp)) == 0);

    /* keypair returns the same seckey it got */
    CHECK(secp256k1_keypair_create(CTX, &keypair, sk) == 1);
    CHECK(secp256k1_keypair_sec(CTX, sk_tmp, &keypair) == 1);
    CHECK(secp256k1_memcmp_var(sk, sk_tmp, sizeof(sk_tmp)) == 0);


    /* Using an invalid keypair is fine for keypair_seckey */
    memset(&keypair, 0, sizeof(keypair));
    CHECK(secp256k1_keypair_sec(CTX, sk_tmp, &keypair) == 1);
    CHECK(secp256k1_memcmp_var(zeros96, sk_tmp, sizeof(sk_tmp)) == 0);

    secp256k1_context_set_error_callback(STATIC_CTX, NULL, NULL);
    secp256k1_context_set_illegal_callback(STATIC_CTX, NULL, NULL);
}